

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

long __thiscall flatbuffers::Table::GetField<long>(Table *this,voffset_t field,long defaultval)

{
  if ((field < *(ushort *)(this + -(long)*(int *)this)) &&
     ((ulong)*(ushort *)(this + ((ulong)field - (long)*(int *)this)) != 0)) {
    defaultval = *(long *)(this + *(ushort *)(this + ((ulong)field - (long)*(int *)this)));
  }
  return defaultval;
}

Assistant:

T GetField(voffset_t field, T defaultval) const {
    auto field_offset = GetOptionalFieldOffset(field);
    return field_offset ? ReadScalar<T>(data_ + field_offset) : defaultval;
  }